

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brkeng.cpp
# Opt level: O2

void __thiscall icu_63::UnhandledEngine::handleCharacter(UnhandledEngine *this,UChar32 c)

{
  UBool UVar1;
  int32_t value;
  UnicodeSet *this_00;
  undefined4 in_register_00000034;
  UErrorCode status;
  
  this_00 = this->fHandled;
  if (this_00 == (UnicodeSet *)0x0) {
    this_00 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,CONCAT44(in_register_00000034,c));
    if (this_00 == (UnicodeSet *)0x0) {
      this->fHandled = (UnicodeSet *)0x0;
      return;
    }
    UnicodeSet::UnicodeSet(this_00);
    this->fHandled = this_00;
  }
  UVar1 = UnicodeSet::contains(this_00,c);
  if (UVar1 == '\0') {
    status = U_ZERO_ERROR;
    value = u_getIntPropertyValue_63(c,UCHAR_SCRIPT);
    UnicodeSet::applyIntPropertyValue(this->fHandled,UCHAR_SCRIPT,value,&status);
  }
  return;
}

Assistant:

void
UnhandledEngine::handleCharacter(UChar32 c) {
    if (fHandled == nullptr) {
        fHandled = new UnicodeSet();
        if (fHandled == nullptr) {
            return;
        }
    }
    if (!fHandled->contains(c)) {
        UErrorCode status = U_ZERO_ERROR;
        // Apply the entire script of the character.
        int32_t script = u_getIntPropertyValue(c, UCHAR_SCRIPT);
        fHandled->applyIntPropertyValue(UCHAR_SCRIPT, script, status);
    }
}